

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O3

void __thiscall create::Serial::~Serial(Serial *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Manager_type p_Var3;
  _func_int ***ppp_Var4;
  int iVar5;
  service *psVar6;
  service_registry *psVar7;
  
  this->_vptr_Serial = (_func_int **)&PTR___cxa_pure_virtual_001566b8;
  disconnect(this);
  p_Var2 = (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var3 = (this->callback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->dataReadyCond);
  if ((this->ioThread)._M_id._M_thread != 0) {
    std::terminate();
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_serial_port_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->port).impl_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::signal_set_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->signals).impl_);
  psVar7 = (this->io).super_execution_context.service_registry_;
  psVar6 = psVar7->first_service_;
  if (psVar6 != (service *)0x0) {
    do {
      (*psVar6->_vptr_service[2])(psVar6);
      psVar6 = psVar6->next_;
    } while (psVar6 != (service *)0x0);
    psVar7 = (this->io).super_execution_context.service_registry_;
    psVar6 = psVar7->first_service_;
    if (psVar6 != (service *)0x0) {
      do {
        ppp_Var4 = &psVar6->_vptr_service;
        psVar6 = psVar6->next_;
        (*(*ppp_Var4)[1])();
        psVar7->first_service_ = psVar6;
      } while (psVar6 != (service *)0x0);
      psVar7 = (this->io).super_execution_context.service_registry_;
      if (psVar7 == (service_registry *)0x0) {
        psVar7 = (service_registry *)0x0;
        goto LAB_001364a9;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&psVar7->mutex_);
LAB_001364a9:
  operator_delete(psVar7);
  p_Var2 = (this->super_enable_shared_from_this<create::Serial>)._M_weak_this.
           super___weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Serial::~Serial() {
    disconnect();
  }